

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

int Cec3_ManSweepNode(Cec3_Man_t *p,int iObj)

{
  Gia_Rpr_t *pGVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Gia_Man_t *pGVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  abctime aVar12;
  Gia_Obj_t *pGVar13;
  Gia_Obj_t *pGVar14;
  word *pwVar15;
  abctime aVar16;
  long lVar17;
  long lVar18;
  
  aVar12 = Abc_Clock();
  pGVar13 = Gia_ManObj(p->pAig,iObj);
  pGVar14 = Gia_ObjReprObj(p->pAig,iObj);
  uVar6 = Abc_LitIsCompl(pGVar13->Value);
  uVar7 = Abc_LitIsCompl(pGVar14->Value);
  uVar6 = ((uint)((ulong)*(undefined8 *)pGVar14 >> 0x20) ^
          (uint)((ulong)*(undefined8 *)pGVar13 >> 0x20)) >> 0x1f ^ uVar7 ^ uVar6;
  iVar8 = Abc_Lit2Var(pGVar14->Value);
  iVar9 = Abc_Lit2Var(pGVar13->Value);
  iVar8 = Cec3_ManSolveTwo(p,iVar8,iVar9,uVar6);
  if (iVar8 == -1) {
    p->nSatUnsat = p->nSatUnsat + 1;
    uVar6 = Abc_LitNotCond(pGVar14->Value,uVar6);
    pGVar13->Value = uVar6;
    iVar8 = 1;
    lVar18 = 0x70;
    uVar6 = 0x10000000;
  }
  else {
    if (iVar8 == 1) {
      uVar3 = p->nPatterns;
      uVar4 = p->nSatSat;
      p->nPatterns = uVar3 + 1;
      p->nSatSat = uVar4 + 1;
      pGVar5 = p->pAig;
      iVar10 = pGVar5->nSimWords * 0x40;
      iVar8 = pGVar5->iPatsPi + 1;
      iVar9 = 1;
      if (pGVar5->iPatsPi == iVar10 + -1) {
        iVar8 = 1;
      }
      pGVar5->iPatsPi = iVar8;
      if ((iVar8 < 1) || (iVar10 <= iVar8)) {
        __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                      ,0x36a,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
      }
      lVar18 = 0x68;
      while( true ) {
        if (p->vObjSatPairs->nSize <= iVar9) break;
        iVar8 = Vec_IntEntry(p->vObjSatPairs,iVar9 + -1);
        iVar10 = Vec_IntEntry(p->vObjSatPairs,iVar9);
        pGVar5 = p->pAig;
        uVar11 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar10);
        pwVar15 = Cec3_ObjSim(pGVar5,iVar8);
        uVar6 = pGVar5->iPatsPi;
        lVar17 = (long)((int)uVar6 >> 5);
        uVar7 = *(uint *)((long)pwVar15 + lVar17 * 4);
        uVar6 = uVar6 & 0x1f;
        if (((uVar7 >> uVar6 & 1) != 0) != uVar11) {
          *(uint *)((long)pwVar15 + lVar17 * 4) = uVar7 ^ 1 << uVar6;
        }
        iVar9 = iVar9 + 2;
      }
      iVar8 = 0;
      goto LAB_005281db;
    }
    p->nSatUndec = p->nSatUndec + 1;
    if (iVar8 != 0) {
      __assert_fail("status == GLUCOSE_UNDEC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                    ,0x37c,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
    }
    iVar8 = 2;
    lVar18 = 0x78;
    uVar6 = 0x20000000;
  }
  pGVar1 = p->pAig->pReprs + iObj;
  *pGVar1 = (Gia_Rpr_t)((uint)*pGVar1 | uVar6);
LAB_005281db:
  aVar16 = Abc_Clock();
  plVar2 = (long *)((long)&p->pPars + lVar18);
  *plVar2 = *plVar2 + (aVar16 - aVar12);
  if (p->pPars->fUseCones == 0) {
    aVar12 = Abc_Clock();
    bmcg_sat_solver_reset(p->pSat);
    aVar16 = Abc_Clock();
    p->timeExtra = p->timeExtra + (aVar16 - aVar12);
  }
  return iVar8;
}

Assistant:

int Cec3_ManSweepNode( Cec3_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec3_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == GLUCOSE_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
//            Cec3_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
            Cec3_ObjSimSetInputBit( p->pAig, IdAig, bmcg_sat_solver_read_cex_varvalue(p->pSat, IdSat) );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == GLUCOSE_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == GLUCOSE_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    bmcg_sat_solver_reset( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
//    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}